

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multipartExamples.cpp
# Opt level: O1

void freeDeepBuffers<float>
               (list<Imf_3_4::Array2D<float_*>,_std::allocator<Imf_3_4::Array2D<float_*>_>_>
                *channels)

{
  _List_node_base *p_Var1;
  void *pvVar2;
  _List_node_base *p_Var3;
  long lVar4;
  long lVar5;
  long lVar6;
  
  for (p_Var1 = (channels->
                super__List_base<Imf_3_4::Array2D<float_*>,_std::allocator<Imf_3_4::Array2D<float_*>_>_>
                )._M_impl._M_node.super__List_node_base._M_next;
      p_Var1 != (_List_node_base *)channels;
      p_Var1 = (((_List_base<Imf_3_4::Array2D<float_*>,_std::allocator<Imf_3_4::Array2D<float_*>_>_>
                  *)&p_Var1->_M_next)->_M_impl)._M_node.super__List_node_base._M_next) {
    if (0 < (long)p_Var1[1]._M_next) {
      lVar6 = 0;
      lVar4 = 0;
      do {
        p_Var3 = p_Var1[1]._M_prev;
        if (0 < (long)p_Var3) {
          lVar5 = 0;
          do {
            pvVar2 = *(void **)(*(long *)(p_Var1 + 1 + 1) + lVar5 * 8 + (long)p_Var3 * lVar6);
            if (pvVar2 != (void *)0x0) {
              operator_delete__(pvVar2);
            }
            lVar5 = lVar5 + 1;
            p_Var3 = p_Var1[1]._M_prev;
          } while (lVar5 < (long)p_Var3);
        }
        lVar4 = lVar4 + 1;
        lVar6 = lVar6 + 8;
      } while (lVar4 < (long)p_Var1[1]._M_next);
    }
  }
  return;
}

Assistant:

void
freeDeepBuffers (list<Array2D<T*>>& channels)
{
    for (auto i = channels.begin (); i != channels.end (); i++)
    {
        Array2D<T*>& channel = *i;
        for (int y = 0; y < channel.height (); y++)
            for (int x = 0; x < channel.width (); x++)
                delete[] channel[y][x];
    }
}